

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trace-type-from-pseudo-trace-type.cpp
# Opt level: O3

unique_ptr<const_yactfr::DataStreamType,_std::default_delete<const_yactfr::DataStreamType>_>
__thiscall
yactfr::internal::TraceTypeFromPseudoTraceTypeConverter::_dstFromPseudoDst
          (TraceTypeFromPseudoTraceTypeConverter *this,PseudoDst *pseudoDst)

{
  PseudoDt *pPVar1;
  _Tuple_impl<0UL,_const_yactfr::MapItem_*,_std::default_delete<const_yactfr::MapItem>_> __fn;
  undefined8 __args;
  iterator iVar2;
  int __flags;
  PseudoDst *pPVar3;
  PseudoTraceType *pPVar4;
  PseudoDst *in_RDX;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *__child_stack;
  long *plVar5;
  _Head_base<0UL,_const_yactfr::TraceType_*,_false> _Var6;
  pointer *__ptr;
  __node_base _Var7;
  PseudoDst *in_R8;
  ClockType *local_d8;
  _Head_base<0UL,_const_yactfr::StructureType_*,_false> local_d0;
  _Head_base<0UL,_const_yactfr::StructureType_*,_false> local_c8;
  undefined1 local_c0 [16];
  _Head_base<0UL,_const_yactfr::TraceType_*,_false> local_b0;
  __uniq_ptr_impl<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> local_a8;
  _Base_ptr local_a0;
  EventRecordTypeSet ertSet;
  PseudoErtSet pseudoErts;
  
  pseudoErts._M_h._M_buckets = &pseudoErts._M_h._M_single_bucket;
  pseudoErts._M_h._M_bucket_count = 1;
  pseudoErts._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  pseudoErts._M_h._M_element_count = 0;
  pseudoErts._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  pseudoErts._M_h._M_rehash_policy._M_next_resize = 0;
  pseudoErts._M_h._M_single_bucket = (__node_base_ptr)0x0;
  ertSet._M_t._M_impl._0_8_ = in_RDX->_id;
  local_c0._8_8_ = this;
  iVar2 = std::
          _Hashtable<unsigned_long_long,_std::pair<const_unsigned_long_long,_std::unordered_map<unsigned_long_long,_yactfr::internal::PseudoOrphanErt,_std::hash<unsigned_long_long>,_std::equal_to<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_yactfr::internal::PseudoOrphanErt>_>_>_>,_std::allocator<std::pair<const_unsigned_long_long,_std::unordered_map<unsigned_long_long,_yactfr::internal::PseudoOrphanErt,_std::hash<unsigned_long_long>,_std::equal_to<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_yactfr::internal::PseudoOrphanErt>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long_long>,_std::hash<unsigned_long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find((_Hashtable<unsigned_long_long,_std::pair<const_unsigned_long_long,_std::unordered_map<unsigned_long_long,_yactfr::internal::PseudoOrphanErt,_std::hash<unsigned_long_long>,_std::equal_to<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_yactfr::internal::PseudoOrphanErt>_>_>_>,_std::allocator<std::pair<const_unsigned_long_long,_std::unordered_map<unsigned_long_long,_yactfr::internal::PseudoOrphanErt,_std::hash<unsigned_long_long>,_std::equal_to<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_yactfr::internal::PseudoOrphanErt>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long_long>,_std::hash<unsigned_long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)(pseudoDst->_id + 0x128),(key_type *)&ertSet);
  if ((iVar2.
       super__Node_iterator_base<std::pair<const_unsigned_long_long,_std::unordered_map<unsigned_long_long,_yactfr::internal::PseudoOrphanErt,_std::hash<unsigned_long_long>,_std::equal_to<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_yactfr::internal::PseudoOrphanErt>_>_>_>,_false>
       ._M_cur != (__node_type *)0x0) &&
     (plVar5 = *(long **)((long)iVar2.
                                super__Node_iterator_base<std::pair<const_unsigned_long_long,_std::unordered_map<unsigned_long_long,_yactfr::internal::PseudoOrphanErt,_std::hash<unsigned_long_long>,_std::equal_to<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_yactfr::internal::PseudoOrphanErt>_>_>_>,_false>
                                ._M_cur + 0x20), plVar5 != (long *)0x0)) {
    do {
      local_c0._0_8_ = plVar5 + 2;
      ertSet._M_t._M_impl._0_8_ =
           (_Hashtable<yactfr::internal::PseudoErt*,yactfr::internal::PseudoErt*,std::allocator<yactfr::internal::PseudoErt*>,std::__detail::_Identity,std::equal_to<yactfr::internal::PseudoErt*>,std::hash<yactfr::internal::PseudoErt*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
            *)&pseudoErts;
      std::
      _Hashtable<yactfr::internal::PseudoErt*,yactfr::internal::PseudoErt*,std::allocator<yactfr::internal::PseudoErt*>,std::__detail::_Identity,std::equal_to<yactfr::internal::PseudoErt*>,std::hash<yactfr::internal::PseudoErt*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<yactfr::internal::PseudoErt*,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<yactfr::internal::PseudoErt*,false>>>>
                ((_Hashtable<yactfr::internal::PseudoErt*,yactfr::internal::PseudoErt*,std::allocator<yactfr::internal::PseudoErt*>,std::__detail::_Identity,std::equal_to<yactfr::internal::PseudoErt*>,std::hash<yactfr::internal::PseudoErt*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)&pseudoErts,local_c0,&ertSet);
      plVar5 = (long *)*plVar5;
    } while (plVar5 != (long *)0x0);
  }
  PseudoDst::validate(in_RDX,&pseudoErts);
  ertSet._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &ertSet._M_t._M_impl.super__Rb_tree_header._M_header;
  ertSet._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  __flags = 0;
  ertSet._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  ertSet._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  __child_stack = extraout_RDX;
  ertSet._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       ertSet._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (pseudoErts._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
    _Var7 = pseudoErts._M_h._M_before_begin;
    do {
      pPVar3 = in_RDX;
      _ertFromPseudoErt((TraceTypeFromPseudoTraceTypeConverter *)local_c0,(PseudoErt *)pseudoDst,
                        (PseudoDst *)_Var7._M_nxt[1]._M_nxt);
      __flags = (int)pPVar3;
      std::
      _Rb_tree<std::unique_ptr<yactfr::EventRecordType_const,std::default_delete<yactfr::EventRecordType_const>>,std::unique_ptr<yactfr::EventRecordType_const,std::default_delete<yactfr::EventRecordType_const>>,std::_Identity<std::unique_ptr<yactfr::EventRecordType_const,std::default_delete<yactfr::EventRecordType_const>>>,yactfr::internal::ErtIdComp,std::allocator<std::unique_ptr<yactfr::EventRecordType_const,std::default_delete<yactfr::EventRecordType_const>>>>
      ::
      _M_insert_unique<std::unique_ptr<yactfr::EventRecordType_const,std::default_delete<yactfr::EventRecordType_const>>>
                ((_Rb_tree<std::unique_ptr<yactfr::EventRecordType_const,std::default_delete<yactfr::EventRecordType_const>>,std::unique_ptr<yactfr::EventRecordType_const,std::default_delete<yactfr::EventRecordType_const>>,std::_Identity<std::unique_ptr<yactfr::EventRecordType_const,std::default_delete<yactfr::EventRecordType_const>>>,yactfr::internal::ErtIdComp,std::allocator<std::unique_ptr<yactfr::EventRecordType_const,std::default_delete<yactfr::EventRecordType_const>>>>
                  *)&ertSet,
                 (unique_ptr<const_yactfr::EventRecordType,_std::default_delete<const_yactfr::EventRecordType>_>
                  *)local_c0);
      std::
      unique_ptr<const_yactfr::EventRecordType,_std::default_delete<const_yactfr::EventRecordType>_>
      ::~unique_ptr((unique_ptr<const_yactfr::EventRecordType,_std::default_delete<const_yactfr::EventRecordType>_>
                     *)local_c0);
      _Var7._M_nxt = (_Var7._M_nxt)->_M_nxt;
      __child_stack = extraout_RDX_00;
    } while (_Var7._M_nxt != (_Hash_node_base *)0x0);
  }
  local_a0 = (_Base_ptr)in_RDX->_id;
  pPVar1 = (in_RDX->_pseudoPktCtxType)._M_t.
           super___uniq_ptr_impl<yactfr::internal::PseudoDt,_std::default_delete<yactfr::internal::PseudoDt>_>
           ._M_t.
           super__Tuple_impl<0UL,_yactfr::internal::PseudoDt_*,_std::default_delete<yactfr::internal::PseudoDt>_>
           .super__Head_base<0UL,_yactfr::internal::PseudoDt_*,_false>._M_head_impl;
  if (pPVar1 == (PseudoDt *)0x0) {
    local_c8._M_head_impl = (StructureType *)0x0;
  }
  else {
    pPVar4 = (PseudoTraceType *)pseudoDst->_id;
    in_R8 = in_RDX;
    dtFromPseudoRootDt((internal *)&local_c8,pPVar1,PacketContext,pPVar4,in_RDX,(PseudoErt *)0x0);
    __flags = (int)pPVar4;
    __child_stack = extraout_RDX_01;
  }
  __args = local_c0._8_8_;
  pPVar1 = (in_RDX->_pseudoErHeaderType)._M_t.
           super___uniq_ptr_impl<yactfr::internal::PseudoDt,_std::default_delete<yactfr::internal::PseudoDt>_>
           ._M_t.
           super__Tuple_impl<0UL,_yactfr::internal::PseudoDt_*,_std::default_delete<yactfr::internal::PseudoDt>_>
           .super__Head_base<0UL,_yactfr::internal::PseudoDt_*,_false>._M_head_impl;
  if (pPVar1 == (PseudoDt *)0x0) {
    local_d0._M_head_impl = (StructureType *)0x0;
  }
  else {
    pPVar4 = (PseudoTraceType *)pseudoDst->_id;
    in_R8 = in_RDX;
    dtFromPseudoRootDt((internal *)&local_d0,pPVar1,EventRecordHeader,pPVar4,in_RDX,(PseudoErt *)0x0
                      );
    __flags = (int)pPVar4;
    __child_stack = extraout_RDX_02;
  }
  pPVar1 = (in_RDX->_pseudoErCommonCtxType)._M_t.
           super___uniq_ptr_impl<yactfr::internal::PseudoDt,_std::default_delete<yactfr::internal::PseudoDt>_>
           ._M_t.
           super__Tuple_impl<0UL,_yactfr::internal::PseudoDt_*,_std::default_delete<yactfr::internal::PseudoDt>_>
           .super__Head_base<0UL,_yactfr::internal::PseudoDt_*,_false>._M_head_impl;
  if (pPVar1 == (PseudoDt *)0x0) {
    local_d8 = (ClockType *)0x0;
  }
  else {
    pPVar4 = (PseudoTraceType *)pseudoDst->_id;
    in_R8 = in_RDX;
    dtFromPseudoRootDt((internal *)&local_d8,pPVar1,EventRecordCommonContext,pPVar4,in_RDX,
                       (PseudoErt *)0x0);
    __flags = (int)pPVar4;
    __child_stack = extraout_RDX_03;
  }
  local_a8._M_t.
  super__Tuple_impl<0UL,_const_yactfr::MapItem_*,_std::default_delete<const_yactfr::MapItem>_>.
  super__Head_base<0UL,_const_yactfr::MapItem_*,_false>._M_head_impl =
       (tuple<const_yactfr::MapItem_*,_std::default_delete<const_yactfr::MapItem>_>)
       in_RDX->_defClkType;
  __fn.super__Head_base<0UL,_const_yactfr::MapItem_*,_false>._M_head_impl =
       (in_RDX->super_WithAttrsMixin)._attrs._M_t.
       super___uniq_ptr_impl<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>.
       _M_t.
       super__Tuple_impl<0UL,_const_yactfr::MapItem_*,_std::default_delete<const_yactfr::MapItem>_>.
       super__Head_base<0UL,_const_yactfr::MapItem_*,_false>;
  if (__fn.super__Head_base<0UL,_const_yactfr::MapItem_*,_false>._M_head_impl == (MapItem *)0x0) {
    _Var6._M_head_impl = (TraceType *)0x0;
  }
  else {
    MapItem::clone((MapItem *)local_c0,
                   (__fn *)__fn.super__Head_base<0UL,_const_yactfr::MapItem_*,_false>._M_head_impl,
                   __child_stack,__flags,in_R8);
    _Var6._M_head_impl = (TraceType *)local_c0._0_8_;
    local_c0._0_8_ =
         (_Tuple_impl<0UL,_const_yactfr::TraceType_*,_std::default_delete<const_yactfr::TraceType>_>
         )0x0;
    std::unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>::~unique_ptr
              ((unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
               local_c0);
  }
  local_b0._M_head_impl = _Var6._M_head_impl;
  std::
  make_unique<yactfr::DataStreamType_const,unsigned_long_long,boost::optional<std::__cxx11::string>const&,boost::optional<std::__cxx11::string>const&,boost::optional<std::__cxx11::string>const&,std::set<std::unique_ptr<yactfr::EventRecordType_const,std::default_delete<yactfr::EventRecordType_const>>,yactfr::internal::ErtIdComp,std::allocator<std::unique_ptr<yactfr::EventRecordType_const,std::default_delete<yactfr::EventRecordType_const>>>>,std::unique_ptr<yactfr::StructureType_const,std::default_delete<yactfr::StructureType_const>>,std::unique_ptr<yactfr::StructureType_const,std::default_delete<yactfr::StructureType_const>>,std::unique_ptr<yactfr::StructureType_const,std::default_delete<yactfr::StructureType_const>>,yactfr::ClockType_const*,std::unique_ptr<yactfr::MapItem_const,std::default_delete<yactfr::MapItem_const>>>
            ((unsigned_long_long *)__args,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_a0,&in_RDX->_ns,&in_RDX->_name,
             (set<std::unique_ptr<const_yactfr::EventRecordType,_std::default_delete<const_yactfr::EventRecordType>_>,_yactfr::internal::ErtIdComp,_std::allocator<std::unique_ptr<const_yactfr::EventRecordType,_std::default_delete<const_yactfr::EventRecordType>_>_>_>
              *)&in_RDX->_uid,
             (unique_ptr<const_yactfr::StructureType,_std::default_delete<const_yactfr::StructureType>_>
              *)&ertSet,
             (unique_ptr<const_yactfr::StructureType,_std::default_delete<const_yactfr::StructureType>_>
              *)&local_c8,
             (unique_ptr<const_yactfr::StructureType,_std::default_delete<const_yactfr::StructureType>_>
              *)&local_d0,&local_d8,
             (unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
             &local_a8);
  std::unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>::~unique_ptr
            ((unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
             &local_b0);
  if (local_d8 != (ClockType *)0x0) {
    std::default_delete<const_yactfr::StructureType>::operator()
              ((default_delete<const_yactfr::StructureType> *)&local_d8,(StructureType *)local_d8);
  }
  if (local_d0._M_head_impl != (StructureType *)0x0) {
    std::default_delete<const_yactfr::StructureType>::operator()
              ((default_delete<const_yactfr::StructureType> *)&local_d0,local_d0._M_head_impl);
  }
  if (local_c8._M_head_impl != (StructureType *)0x0) {
    std::default_delete<const_yactfr::StructureType>::operator()
              ((default_delete<const_yactfr::StructureType> *)&local_c8,local_c8._M_head_impl);
  }
  std::
  _Rb_tree<std::unique_ptr<const_yactfr::EventRecordType,_std::default_delete<const_yactfr::EventRecordType>_>,_std::unique_ptr<const_yactfr::EventRecordType,_std::default_delete<const_yactfr::EventRecordType>_>,_std::_Identity<std::unique_ptr<const_yactfr::EventRecordType,_std::default_delete<const_yactfr::EventRecordType>_>_>,_yactfr::internal::ErtIdComp,_std::allocator<std::unique_ptr<const_yactfr::EventRecordType,_std::default_delete<const_yactfr::EventRecordType>_>_>_>
  ::~_Rb_tree(&ertSet._M_t);
  std::
  _Hashtable<yactfr::internal::PseudoErt_*,_yactfr::internal::PseudoErt_*,_std::allocator<yactfr::internal::PseudoErt_*>,_std::__detail::_Identity,_std::equal_to<yactfr::internal::PseudoErt_*>,_std::hash<yactfr::internal::PseudoErt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&pseudoErts._M_h);
  return (unique_ptr<const_yactfr::DataStreamType,_std::default_delete<const_yactfr::DataStreamType>_>
          )(DataStreamType *)__args;
}

Assistant:

std::unique_ptr<const DataStreamType> TraceTypeFromPseudoTraceTypeConverter::_dstFromPseudoDst(PseudoDst& pseudoDst)
{
    // collect pseudo child event record types
    PseudoErtSet pseudoErts;
    const auto it = _pseudoTraceType->pseudoOrphanErts().find(pseudoDst.id());

    if (it != _pseudoTraceType->pseudoOrphanErts().end()) {
        for (auto& ertIdPseudoOrphanErtPair : it->second) {
            pseudoErts.insert(&ertIdPseudoOrphanErtPair.second.pseudoErt());
        }
    }

    // validate pseudo data stream type before converting
    pseudoDst.validate(pseudoErts);

    // convert pseudo event record types
    EventRecordTypeSet ertSet;

    for (auto pseudoErt : pseudoErts) {
        ertSet.insert(this->_ertFromPseudoErt(*pseudoErt, pseudoDst));
    }

    // create yactfr data stream type
    return DataStreamType::create(pseudoDst.id(), pseudoDst.ns(), pseudoDst.name(),
                                  pseudoDst.uid(), std::move(ertSet),
                                  this->_scopeStructTypeFromPseudoDt(pseudoDst.pseudoPktCtxType(),
                                                                     Scope::PacketContext,
                                                                     &pseudoDst),
                                  this->_scopeStructTypeFromPseudoDt(pseudoDst.pseudoErHeaderType(),
                                                                     Scope::EventRecordHeader,
                                                                     &pseudoDst),
                                  this->_scopeStructTypeFromPseudoDt(pseudoDst.pseudoErCommonCtxType(),
                                                                     Scope::EventRecordCommonContext,
                                                                     &pseudoDst),
                                  pseudoDst.defClkType(), tryCloneAttrs(pseudoDst.attrs()));
}